

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFailureTest.cpp
# Opt level: O0

void __thiscall
TEST_TestFailure_UnsignedLongLongsEqualFailure_Test::
TEST_TestFailure_UnsignedLongLongsEqualFailure_Test
          (TEST_TestFailure_UnsignedLongLongsEqualFailure_Test *this)

{
  TEST_TestFailure_UnsignedLongLongsEqualFailure_Test *this_local;
  
  memset(this,0,0x10);
  TEST_GROUP_CppUTestGroupTestFailure::TEST_GROUP_CppUTestGroupTestFailure
            (&this->super_TEST_GROUP_CppUTestGroupTestFailure);
  (this->super_TEST_GROUP_CppUTestGroupTestFailure).super_Utest._vptr_Utest =
       (_func_int **)&PTR__TEST_TestFailure_UnsignedLongLongsEqualFailure_Test_003dc5f8;
  return;
}

Assistant:

TEST(TestFailure, UnsignedLongLongsEqualFailure)
{
#if CPPUTEST_USE_LONG_LONG
    UnsignedLongLongsEqualFailure f(test, failFileName, failLineNumber, 1, 2, "");
    FAILURE_EQUAL("expected <1 (0x1)>\n\tbut was  <2 (0x2)>", f);
#else
    cpputest_ulonglong dummy_ulonglong;
    UnsignedLongLongsEqualFailure f(test, failFileName, failLineNumber, dummy_ulonglong, dummy_ulonglong, "");
    FAILURE_EQUAL("expected <<ulonglong_unsupported> >\n\tbut was  <<ulonglong_unsupported> >", f);
#endif
}